

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

int llvm::APInt::tcMultiply(WordType *dst,WordType *lhs,WordType *rhs,uint parts)

{
  uint uVar1;
  uint local_2c;
  uint local_28;
  uint i;
  int overflow;
  uint parts_local;
  WordType *rhs_local;
  WordType *lhs_local;
  WordType *dst_local;
  
  if (dst == lhs || dst == rhs) {
    __assert_fail("dst != lhs && dst != rhs",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x9ad,
                  "static int llvm::APInt::tcMultiply(WordType *, const WordType *, const WordType *, unsigned int)"
                 );
  }
  local_28 = 0;
  tcSet(dst,0,parts);
  for (local_2c = 0; local_2c < parts; local_2c = local_2c + 1) {
    uVar1 = tcMultiplyPart(dst + local_2c,lhs,rhs[local_2c],0,parts,parts - local_2c,true);
    local_28 = uVar1 | local_28;
  }
  return local_28;
}

Assistant:

int APInt::tcMultiply(WordType *dst, const WordType *lhs,
                      const WordType *rhs, unsigned parts) {
  assert(dst != lhs && dst != rhs);

  int overflow = 0;
  tcSet(dst, 0, parts);

  for (unsigned i = 0; i < parts; i++)
    overflow |= tcMultiplyPart(&dst[i], lhs, rhs[i], 0, parts,
                               parts - i, true);

  return overflow;
}